

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

int rgb_to_565(int r,int g,int b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  
  iVar1 = convert_bit_range(in_EDI,8,5);
  iVar2 = convert_bit_range(in_ESI,8,6);
  uVar3 = convert_bit_range(in_EDX,8,5);
  return iVar1 << 0xb | iVar2 << 5 | uVar3;
}

Assistant:

int rgb_to_565( int r, int g, int b )
{
	return
		(convert_bit_range( r, 8, 5 ) << 11) |
		(convert_bit_range( g, 8, 6 ) << 05) |
		(convert_bit_range( b, 8, 5 ) << 00);
}